

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[44],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [44],uint *RestArgs,char (*RestArgs_1) [13],char **RestArgs_2,
               char (*RestArgs_3) [32],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_4)

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)(ss + 0x10));
  FormatStrSS<std::__cxx11::stringstream,char[13],char_const*,char[32],std::__cxx11::string>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}